

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_read_string(sexp ctx,sexp in,int sentinel)

{
  sexp *ppsVar1;
  sexp psVar2;
  sexp psVar3;
  sexp_uint_t sVar4;
  uint uVar5;
  ushort **ppuVar6;
  char *__dest;
  int iVar7;
  size_t sVar8;
  int iVar9;
  char *str;
  ulong uStack_e0;
  sexp local_c8;
  char initbuf [128];
  
  psVar2 = (in->value).type.setters;
  if (psVar2 == (sexp)0x0) {
    uVar5 = getc((FILE *)(in->value).type.getters);
  }
  else {
    psVar3 = (in->value).type.print;
    if (psVar3 < (sexp)(in->value).port.size) {
      (in->value).type.print = (sexp)((long)&psVar3->tag + 1);
      uStack_e0 = (ulong)*(byte *)((long)&psVar3->tag + (long)&psVar2->tag);
      goto LAB_00113401;
    }
    uVar5 = sexp_buffered_read_char(ctx,in);
  }
  uStack_e0 = (ulong)uVar5;
LAB_00113401:
  local_c8 = (sexp)&DAT_0000003e;
  str = initbuf;
  sVar8 = 0x80;
  iVar7 = 0;
  do {
    iVar9 = (int)uStack_e0;
    if (iVar9 == sentinel) {
LAB_001137f4:
      if ((((ulong)local_c8 & 3) != 0) || (local_c8->tag != 0x13)) {
        str[iVar7] = '\0';
        local_c8 = sexp_c_string(ctx,str,(long)iVar7);
      }
      if (sVar8 != 0x80) {
        free(str);
      }
      return local_c8;
    }
    if (iVar9 == 10) {
      ppsVar1 = &(in->value).type.dl;
      *ppsVar1 = (sexp)((long)&(*ppsVar1)->tag + 1);
      uStack_e0 = 10;
LAB_00113598:
      str[iVar7] = (char)uStack_e0;
      iVar7 = iVar7 + 1;
LAB_0011359f:
      if ((long)sVar8 <= (long)(iVar7 + 4)) {
        __dest = (char *)malloc(sVar8 * 2);
        if (__dest == (char *)0x0) {
          local_c8 = (((ctx->value).type.setters)->value).type.print;
          goto LAB_001137f4;
        }
        memcpy(__dest,str,(long)iVar7);
        if (sVar8 == 0x80) {
          sVar8 = 0x100;
          str = __dest;
        }
        else {
          free(str);
          sVar8 = sVar8 * 2;
          str = __dest;
        }
      }
    }
    else {
      if (iVar9 != 0x5c) {
        if (iVar9 != -1) goto LAB_00113598;
        local_c8 = sexp_read_error(ctx,"premature end of string",(sexp)&DAT_0000023e,in);
        goto LAB_001137f4;
      }
      psVar2 = (in->value).type.setters;
      if (psVar2 == (sexp)0x0) {
        uVar5 = getc((FILE *)(in->value).type.getters);
LAB_00113488:
        uStack_e0 = (ulong)uVar5;
      }
      else {
        psVar3 = (in->value).type.print;
        if ((sexp)(in->value).port.size <= psVar3) {
          uVar5 = sexp_buffered_read_char(ctx,in);
          goto LAB_00113488;
        }
        (in->value).type.print = (sexp)((long)&psVar3->tag + 1);
        uStack_e0 = (ulong)*(byte *)((long)&psVar3->tag + (long)&psVar2->tag);
      }
      iVar9 = (int)uStack_e0;
      if (iVar9 == 0x58) {
LAB_001134c0:
        local_c8 = sexp_read_number(ctx,in,0x10,0);
        if (((ulong)local_c8 & 1) != 0) {
          psVar2 = (in->value).type.setters;
          if (psVar2 == (sexp)0x0) {
            uVar5 = getc((FILE *)(in->value).type.getters);
          }
          else {
            psVar3 = (in->value).type.print;
            if (psVar3 < (sexp)(in->value).port.size) {
              (in->value).type.print = (sexp)((long)&psVar3->tag + 1);
              uVar5 = (uint)*(byte *)((long)&psVar3->tag + (long)&psVar2->tag);
            }
            else {
              uVar5 = sexp_buffered_read_char(ctx,in);
            }
          }
          if ((uVar5 != 0xffffffff) && (uVar5 != 0x3b)) {
            sVar4 = (in->value).bytecode.max_depth;
            if (sVar4 == 0) {
              ungetc(uVar5,(FILE *)(in->value).type.getters);
            }
            else {
              psVar2 = (in->value).type.print;
              (in->value).type.print = (sexp)((long)&psVar2[-1].value + 0x60bf);
              *(char *)((sVar4 - 1) + (long)psVar2) = (char)uVar5;
            }
          }
          uStack_e0 = (ulong)local_c8 >> 1;
          uVar5 = (uint)uStack_e0;
          if (uVar5 < 0x81) goto LAB_00113586;
          iVar9 = 1;
          if ((0x7f < (int)uVar5) && (iVar9 = 2, 0x7ff < uVar5)) {
            iVar9 = 4 - (uint)(uVar5 < 0x10000);
          }
          sexp_utf8_encode_char((uchar *)(str + iVar7),iVar9,uVar5);
          iVar7 = iVar7 + iVar9;
          goto LAB_0011359f;
        }
LAB_00113586:
        if ((((ulong)local_c8 & 3) != 0) || (local_c8->tag != 0x13)) goto LAB_00113598;
        goto LAB_001137f4;
      }
      if (iVar9 == 0x61) {
        uStack_e0 = 7;
        goto LAB_00113586;
      }
      if (iVar9 == 0x78) goto LAB_001134c0;
      if (iVar9 == 0x6e) {
        uStack_e0 = 10;
        goto LAB_00113586;
      }
      if (iVar9 == 0x72) {
        uStack_e0 = 0xd;
        goto LAB_00113586;
      }
      if (iVar9 == 0x74) {
        uStack_e0 = 9;
        goto LAB_00113586;
      }
      if (iVar9 == 0x62) {
        uStack_e0 = 8;
        goto LAB_00113586;
      }
      ppuVar6 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar6 + (long)iVar9 * 2 + 1) & 0x20) == 0) goto LAB_00113586;
      while ((iVar9 = (int)uStack_e0, iVar9 == 9 || (iVar9 == 0x20))) {
        psVar2 = (in->value).type.setters;
        if (psVar2 == (sexp)0x0) {
          uVar5 = getc((FILE *)(in->value).type.getters);
          uStack_e0 = (ulong)uVar5;
        }
        else {
          psVar3 = (in->value).type.print;
          if (psVar3 < (sexp)(in->value).port.size) {
            (in->value).type.print = (sexp)((long)&psVar3->tag + 1);
            uStack_e0 = (ulong)*(byte *)((long)&psVar3->tag + (long)&psVar2->tag);
          }
          else {
            uVar5 = sexp_buffered_read_char(ctx,in);
            uStack_e0 = (ulong)uVar5;
          }
        }
      }
      if (iVar9 == 0xd) {
        psVar2 = (in->value).type.setters;
        if (psVar2 == (sexp)0x0) {
          uVar5 = getc((FILE *)(in->value).type.getters);
        }
        else {
          psVar3 = (in->value).type.print;
          if (psVar3 < (sexp)(in->value).port.size) {
            (in->value).type.print = (sexp)((long)&psVar3->tag + 1);
            uStack_e0 = (ulong)*(byte *)((long)&psVar3->tag + (long)&psVar2->tag);
            goto LAB_00113737;
          }
          uVar5 = sexp_buffered_read_char(ctx,in);
        }
        uStack_e0 = (ulong)uVar5;
      }
LAB_00113737:
      if ((int)uStack_e0 != 10) goto LAB_00113586;
      ppsVar1 = &(in->value).type.dl;
      *ppsVar1 = (sexp)((long)&(*ppsVar1)->tag + 1);
      do {
        psVar2 = (in->value).type.setters;
        if (psVar2 == (sexp)0x0) {
          uVar5 = getc((FILE *)(in->value).type.getters);
        }
        else {
          psVar3 = (in->value).type.print;
          if (psVar3 < (sexp)(in->value).port.size) {
            (in->value).type.print = (sexp)((long)&psVar3->tag + 1);
            uVar5 = (uint)*(byte *)((long)&psVar3->tag + (long)&psVar2->tag);
          }
          else {
            uVar5 = sexp_buffered_read_char(ctx,in);
          }
        }
      } while ((uVar5 == 9) || (uVar5 == 0x20));
      if (uVar5 != 0xffffffff) {
        sVar4 = (in->value).bytecode.max_depth;
        if (sVar4 == 0) {
          ungetc(uVar5,(FILE *)(in->value).type.getters);
        }
        else {
          psVar2 = (in->value).type.print;
          (in->value).type.print = (sexp)((long)&psVar2[-1].value + 0x60bf);
          *(char *)((sVar4 - 1) + (long)psVar2) = (char)uVar5;
        }
      }
    }
    psVar2 = (in->value).type.setters;
    if (psVar2 == (sexp)0x0) {
      uVar5 = getc((FILE *)(in->value).type.getters);
      uStack_e0 = (ulong)uVar5;
    }
    else {
      psVar3 = (in->value).type.print;
      if (psVar3 < (sexp)(in->value).port.size) {
        (in->value).type.print = (sexp)((long)&psVar3->tag + 1);
        uStack_e0 = (ulong)*(byte *)((long)&psVar3->tag + (long)&psVar2->tag);
      }
      else {
        uVar5 = sexp_buffered_read_char(ctx,in);
        uStack_e0 = (ulong)uVar5;
      }
    }
  } while( true );
}

Assistant:

sexp sexp_read_string (sexp ctx, sexp in, int sentinel) {
#if SEXP_USE_UTF8_STRINGS
  int len;
#endif
  int c, i=0;
  sexp_sint_t size=INIT_STRING_BUFFER_SIZE;
  char initbuf[INIT_STRING_BUFFER_SIZE];
  char *buf=initbuf, *tmp;
  sexp res = SEXP_FALSE;

  for (c = sexp_read_char(ctx, in); c != sentinel; c = sexp_read_char(ctx, in)) {
    if (c == '\\') {
      c = sexp_read_char(ctx, in);
      switch (c) {
      case 'a': c = '\a'; break;
      case 'b': c = '\b'; break;
      case 'n': c = '\n'; break;
      case 'r': c = '\r'; break;
      case 't': c = '\t'; break;
      case 'x': case 'X':
        res = sexp_read_number(ctx, in, 16, 0);
        if (sexp_fixnump(res)) {
          c = sexp_read_char(ctx, in);
          if (c != ';') {
#if SEXP_USE_ESCAPE_REQUIRES_TRAILING_SEMI_COLON
            res = sexp_read_error(ctx, "missing ; in \\x escape", SEXP_NULL, in);
#else
            sexp_push_char(ctx, c, in);
#endif
          }
          c = sexp_unbox_fixnum(res);
#if SEXP_USE_UTF8_STRINGS
          if ((unsigned)c > 0x80) {
            len = sexp_utf8_char_byte_count(c);
            sexp_utf8_encode_char((unsigned char*)buf + i, len, c);
            i += len;
            goto maybe_expand;
          }
#endif
        }
        break;
#if SEXP_USE_ESCAPE_NEWLINE
      default:
        if (isspace(c)) {
          while (c==' ' || c=='\t') c=sexp_read_char(ctx, in);
          if (c=='\r') c=sexp_read_char(ctx, in);
          if (c=='\n') {
            sexp_port_line(in)++;
            do {c=sexp_read_char(ctx, in);} while (c==' ' || c=='\t');
            sexp_push_char(ctx, c, in);
            continue;
          }
        }
#endif
      }
      if (sexp_exceptionp(res)) break;
    } else if (c == '\n') {
      sexp_port_line(in)++;
    } else if (c == EOF) {
      res = sexp_read_error(ctx, "premature end of string", SEXP_NULL, in);
      break;
    }
    buf[i++] = c;
  maybe_expand:
    if (i+4 >= size) {       /* expand buffer w/ malloc(), later free() it */
      tmp = (char*) sexp_malloc(size*2);
      if (!tmp) {res = sexp_global(ctx, SEXP_G_OOM_ERROR); break;}
      memcpy(tmp, buf, i);
      if (size != INIT_STRING_BUFFER_SIZE) free(buf);
      buf = tmp;
      size *= 2;
    }
  }

  if (!sexp_exceptionp(res)) {
    buf[i] = '\0';
    res = sexp_c_string(ctx, buf, i);
  }
  if (size != INIT_STRING_BUFFER_SIZE) free(buf);
  return res;
}